

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::FuncArgsContext::markStackArgsReg(FuncArgsContext *this,FuncFrame *frame)

{
  bool bVar1;
  FuncAttributes *in_RSI;
  long *in_RDI;
  Var *var;
  
  if (*(char *)((long)in_RDI + 0x15) == -1) {
    bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                      (*in_RSI,kHasPreservedFP);
    if (bVar1) {
      *(byte *)((long)in_RSI + 6) = *(byte *)(*in_RDI + 1);
    }
  }
  else {
    *(byte *)((long)in_RSI + 6) =
         (byte)((uint)*(undefined4 *)
                       ((long)in_RDI + (ulong)*(byte *)((long)in_RDI + 0x15) * 8 + 0x11c) >> 0x10);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::markStackArgsReg(FuncFrame& frame) noexcept {
  if (_saVarId != kVarIdNone) {
    const Var& var = _vars[_saVarId];
    frame.setSARegId(var.cur.regId());
  }
  else if (frame.hasPreservedFP()) {
    frame.setSARegId(archTraits().fpRegId());
  }

  return kErrorOk;
}